

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSRGBDecodeTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles31::Functional::anon_unknown_0::DecodeToggledCase::verifyResult(DecodeToggledCase *this)

{
  TestLog *pTVar1;
  bool bVar2;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> pixelResultList;
  allocator<char> local_1e9;
  Vector<bool,_4> local_1e8 [8];
  _Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_1c8;
  Vec4 local_1a8;
  undefined1 local_198 [8];
  _func_int **pp_Stack_190;
  
  pTVar1 = ((this->super_SRGBTestCase).super_TestCase.m_context)->m_testCtx->m_log;
  local_1c8._M_impl.super__Vector_impl_data._M_start = (Vector<float,_4> *)0x0;
  local_1c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  SRGBTestCase::readResultTextures(&this->super_SRGBTestCase);
  SRGBTestCase::storeResultPixels
            (&this->super_SRGBTestCase,
             (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&local_1c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_198,"Expected color: ",(allocator<char> *)local_1e8);
  local_1a8.m_data[0] = 0.0;
  local_1a8.m_data[1] = 1.0;
  local_1a8.m_data[2] = 0.0;
  local_1a8.m_data[3] = 1.0;
  SRGBTestCase::logColor(&this->super_SRGBTestCase,(string *)local_198,0,&local_1a8);
  std::__cxx11::string::~string((string *)local_198);
  local_198 = (undefined1  [8])0x3f80000000000000;
  pp_Stack_190 = (_func_int **)0x3f80000000000000;
  tcu::equal<float,4>((tcu *)local_1e8,local_1c8._M_impl.super__Vector_impl_data._M_start,
                      (Vector<float,_4> *)local_198);
  bVar2 = tcu::boolAll<4>(local_1e8);
  local_198 = (undefined1  [8])pTVar1;
  if (bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_190);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1e8,"returned pass color from GPU",&local_1e9);
    std::operator<<((ostream *)&pp_Stack_190,(string *)local_1e8);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_190);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1e8,"returned fail color from GPU",&local_1e9);
    std::operator<<((ostream *)&pp_Stack_190,(string *)local_1e8);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::string::~string((string *)local_1e8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_190);
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            (&local_1c8);
  return bVar2;
}

Assistant:

bool DecodeToggledCase::verifyResult (void)
{
	tcu::TestLog&			log				= m_context.getTestContext().getLog();
	const int				resultColorIdx	= 0;
	std::vector<tcu::Vec4>	pixelResultList;

	this->readResultTextures();
	this->storeResultPixels(pixelResultList);
	this->logColor(std::string("Expected color: "), resultColorIdx, getColorGreenPass());

	//	result color is either green (pass) or fail (red)
	if ( tcu::boolAll(tcu::equal(pixelResultList[resultColorIdx], getColorGreenPass())) )
	{
		log << tcu::TestLog::Message << std::string("returned pass color from GPU") << tcu::TestLog::EndMessage;
		return true;
	}
	else
	{
		log << tcu::TestLog::Message << std::string("returned fail color from GPU") << tcu::TestLog::EndMessage;
		return false;
	}
}